

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeTypeof(ExpressionContext *ctx,SynTypeof *syntax)

{
  bool bVar1;
  ExpressionContext *this;
  byte local_29;
  ExprBase *value;
  SynTypeof *syntax_local;
  ExpressionContext *ctx_local;
  
  ctx_local = (ExpressionContext *)AnalyzeExpression(ctx,syntax->value);
  if ((TypeBase *)ctx_local->moduleRoot == ctx->typeAuto) {
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
  }
  bVar1 = isType<ExprTypeLiteral>((ExprBase *)ctx_local);
  if (!bVar1) {
    ResolveInitializerValue(ctx,&syntax->super_SynBase,(ExprBase *)ctx_local);
    bVar1 = isType<TypeArgumentSet>((TypeBase *)ctx_local->moduleRoot);
    local_29 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>((TypeBase *)ctx_local->moduleRoot);
      local_29 = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>((TypeBase *)ctx_local->moduleRoot);
        local_29 = bVar1 ^ 0xff;
      }
    }
    if ((local_29 & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2e00,"ExprBase *AnalyzeTypeof(ExpressionContext &, SynTypeof *)");
    }
    this = (ExpressionContext *)ExpressionContext::get<ExprTypeLiteral>(ctx);
    ExprTypeLiteral::ExprTypeLiteral
              ((ExprTypeLiteral *)this,&syntax->super_SynBase,ctx->typeTypeID,
               (TypeBase *)ctx_local->moduleRoot);
    ctx_local = this;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeTypeof(ExpressionContext &ctx, SynTypeof *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(value->type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

	if(isType<ExprTypeLiteral>(value))
		return value;

	ResolveInitializerValue(ctx, syntax, value);

	assert(!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type));

	return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, value->type);
}